

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O1

void __thiscall
QTextDocumentLayoutPrivate::drawListItem
          (QTextDocumentLayoutPrivate *this,QPointF *offset,QPainter *painter,PaintContext *context,
          QTextBlock *bl,QTextCharFormat *selectionFormat)

{
  QAbstractTextDocumentLayout *this_00;
  Data *pDVar1;
  char16_t *pcVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  qreal qVar5;
  qreal qVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  LayoutDirection LVar10;
  uint uVar11;
  QPaintDevice *pQVar12;
  QTextObject *this_01;
  QTextLayout *this_02;
  QRectF *pQVar13;
  QBrush *pQVar14;
  QPen *pQVar15;
  long in_FS_OFFSET;
  double dVar16;
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  double dVar21;
  undefined1 auVar20 [16];
  double dVar22;
  undefined1 auVar23 [16];
  double dVar24;
  undefined1 auVar25 [16];
  QTextLine QVar26;
  QColor QVar27;
  QPointF QVar28;
  QTextLayout layout;
  QTextOption option;
  QBrush brush;
  QFontMetrics fontMetrics;
  QBrush fg;
  double local_1f8;
  QPen local_168 [6];
  QBrush local_138 [4];
  QRectF local_118;
  QBrush local_f0;
  QRectF local_e8;
  undefined1 *local_c8;
  QTextEngine *pQStack_c0;
  QString local_b8;
  QFontMetrics local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractTextDocumentLayout **)
             &(this->super_QAbstractTextDocumentLayoutPrivate).field_0x8;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextBlock::blockFormat((QTextBlock *)local_68);
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextBlock::charFormat((QTextBlock *)local_78);
  local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextCharFormat::font((QTextCharFormat *)local_88);
  pQVar12 = QAbstractTextDocumentLayout::paintDevice(this_00);
  if (pQVar12 != (QPaintDevice *)0x0) {
    pQVar12 = QAbstractTextDocumentLayout::paintDevice(this_00);
    QFont::QFont((QFont *)&local_58,(QFont *)local_88,pQVar12);
    uVar3 = local_88._0_8_;
    local_88._0_8_ = local_58.xp;
    local_58.xp = (qreal)uVar3;
    uVar4 = local_88._8_4_;
    local_88._8_4_ = local_58.yp._0_4_;
    local_58.yp = (qreal)CONCAT44(local_58.yp._4_4_,uVar4);
    QFont::~QFont((QFont *)&local_58);
  }
  local_a0.d.d.ptr = (QExplicitlySharedDataPointer<QFontPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QFontMetrics::QFontMetrics(&local_a0,(QFont *)local_88);
  this_01 = QTextDocument::objectForFormat
                      ((this->super_QAbstractTextDocumentLayoutPrivate).document,
                       (QTextFormat *)local_68);
  local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextObject::format((QTextObject *)&local_58);
  QTextFormat::toListFormat((QTextFormat *)local_98);
  QTextFormat::~QTextFormat((QTextFormat *)&local_58);
  iVar8 = QTextFormat::intProperty((QTextFormat *)local_98,0x3000);
  local_b8.d.d = (Data *)0x0;
  local_b8.d.ptr = (char16_t *)0x0;
  local_b8.d.size = 0;
  bVar7 = QTextFormat::hasProperty((QTextFormat *)local_68,0x3000);
  if (bVar7) {
    iVar8 = QTextFormat::intProperty((QTextFormat *)local_68,0x3000);
  }
  this_02 = QTextBlock::layout(bl);
  iVar9 = QTextLayout::lineCount(this_02);
  if (iVar9 == 0) goto LAB_004f2021;
  local_c8 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_c0 = (QTextEngine *)&DAT_aaaaaaaaaaaaaaaa;
  QVar26 = QTextLayout::lineAt(this_02,0);
  pQStack_c0 = QVar26.eng;
  local_c8 = (undefined1 *)CONCAT44(local_c8._4_4_,QVar26.index);
  QVar28 = QTextLayout::position(this_02);
  dVar21 = offset->xp;
  dVar18 = offset->yp;
  LVar10 = QTextBlock::textDirection(bl);
  local_58.w = -NAN;
  local_58.h = -NAN;
  local_58.xp = -NAN;
  local_58.yp = -NAN;
  pQVar13 = QTextLine::naturalTextRect(&local_58,(QTextLine *)&local_c8);
  dVar18 = dVar18 + QVar28.yp;
  dVar21 = dVar21 + QVar28.xp;
  auVar17._0_8_ = (double)((ulong)dVar18 & 0x8000000000000000 | 0x3fe0000000000000) + dVar18;
  auVar17._8_8_ = (double)((ulong)dVar21 & 0x8000000000000000 | 0x3fe0000000000000) + dVar21;
  auVar25._0_8_ =
       (double)((ulong)local_58.yp & 0x8000000000000000 | 0x3fe0000000000000) + local_58.yp;
  auVar25._8_8_ =
       (double)((ulong)local_58.xp & 0x8000000000000000 | 0x3fe0000000000000) + local_58.xp;
  auVar23 = minpd(_DAT_00684790,auVar17);
  auVar17 = minpd(_DAT_00684790,auVar25);
  auVar20._4_4_ = -(uint)(-2147483648.0 < auVar17._8_8_);
  auVar20._0_4_ = -(uint)(-2147483648.0 < auVar17._0_8_);
  auVar20._8_4_ = -(uint)(-2147483648.0 < auVar23._0_8_);
  auVar20._12_4_ = -(uint)(-2147483648.0 < auVar23._8_8_);
  uVar11 = movmskps((int)pQVar13,auVar20);
  dVar18 = (double)(int)auVar23._0_8_;
  dVar21 = -2147483648.0;
  if ((uVar11 & 8) != 0) {
    dVar21 = (double)(int)auVar23._8_8_;
  }
  if ((uVar11 & 4) == 0) {
    dVar18 = -2147483648.0;
  }
  dVar22 = (double)(int)auVar17._0_8_;
  if ((uVar11 & 2) == 0) {
    dVar16 = -2147483648.0;
  }
  else {
    dVar16 = (double)(int)auVar17._8_8_;
  }
  if ((uVar11 & 1) == 0) {
    dVar22 = -2147483648.0;
  }
  dVar19 = local_58.w;
  if (LVar10 != RightToLeft) {
    dVar19 = -0.0;
  }
  uVar11 = iVar8 + 8;
  if (uVar11 < 5) {
    QTextList::itemText((QString *)&local_58,(QTextList *)this_01,bl);
    qVar6 = local_58.w;
    qVar5 = local_58.xp;
    pcVar2 = local_b8.d.ptr;
    pDVar1 = local_b8.d.d;
    local_58.xp = (qreal)local_b8.d.d;
    local_b8.d.d = (Data *)qVar5;
    local_b8.d.ptr = (char16_t *)local_58.yp;
    local_58.yp = (qreal)pcVar2;
    local_58.w = (qreal)local_b8.d.size;
    local_b8.d.size = (qsizetype)qVar6;
    if ((QFontPrivate *)pDVar1 != (QFontPrivate *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar1->super_QArrayData,2,0x10);
      }
    }
    iVar8 = QFontMetrics::horizontalAdvance(&local_a0,&local_b8,-1);
    iVar9 = QFontMetrics::height(&local_a0);
    dVar24 = (double)iVar9;
    local_1f8 = (double)iVar8;
  }
  else {
    if (2 < iVar8 + 3U) goto LAB_004f2021;
    iVar8 = QFontMetrics::lineSpacing(&local_a0);
    dVar24 = (double)(iVar8 / 3);
    local_1f8 = dVar24;
  }
  local_e8.xp = dVar19 + dVar21 + dVar16;
  local_e8.yp = dVar18 + dVar22;
  local_e8.w = local_1f8;
  local_e8.h = dVar24;
  iVar8 = QFontMetrics::horizontalAdvance(&local_a0,(QChar)0x20);
  dVar21 = (double)iVar8;
  if (LVar10 == LeftToRight) {
    dVar21 = -dVar21 - local_1f8;
  }
  iVar8 = QFontMetrics::height(&local_a0);
  local_e8.xp = dVar21 + local_e8.xp;
  local_e8.yp = dVar24 * -0.5 + (double)(iVar8 / 2) + local_e8.yp;
  QPainter::save(painter);
  QPainter::setRenderHint(painter,Antialiasing,true);
  QTextBlock::blockFormat((QTextBlock *)&local_58);
  iVar8 = QTextFormat::intProperty((QTextFormat *)&local_58,0x10a0);
  QTextFormat::~QTextFormat((QTextFormat *)&local_58);
  iVar9 = (int)selectionFormat;
  if (selectionFormat == (QTextCharFormat *)0x0) {
    local_58.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    QTextFormat::brushProperty((QTextFormat *)&local_58,(int)local_78);
    bVar7 = QBrush::doCompareEqualStyle((QBrush *)&local_58,NoBrush);
    if (bVar7) {
      pQVar14 = QPalette::brush(&context->palette,Current,Text);
      QBrush::operator=((QBrush *)&local_58,pQVar14);
    }
    QPen::QPen((QPen *)&local_118,(QBrush *)&local_58,0.0,SolidLine,SquareCap,BevelJoin);
    QPainter::setPen(painter,(QPen *)&local_118);
    QPen::~QPen((QPen *)&local_118);
LAB_004f1bbc:
    QBrush::~QBrush((QBrush *)&local_58);
    local_f0.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (DataPtr)&DAT_aaaaaaaaaaaaaaaa;
    pQVar14 = QPalette::brush(&context->palette,Current,Text);
    QBrush::QBrush(&local_f0,pQVar14);
    if (iVar8 != 0) goto LAB_004f1c02;
  }
  else {
    QTextFormat::brushProperty((QTextFormat *)&local_118,iVar9);
    QPen::QPen((QPen *)&local_58,(QBrush *)&local_118,0.0,SolidLine,SquareCap,BevelJoin);
    QPainter::setPen(painter,(QPen *)&local_58);
    QPen::~QPen((QPen *)&local_58);
    QBrush::~QBrush((QBrush *)&local_118);
    if (iVar8 == 0) {
      QTextFormat::brushProperty((QTextFormat *)&local_58,iVar9);
      QPainter::fillRect(painter,&local_e8,(QBrush *)&local_58);
      goto LAB_004f1bbc;
    }
    local_f0.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (DataPtr)&DAT_aaaaaaaaaaaaaaaa;
    pQVar14 = QPalette::brush(&context->palette,Current,Text);
    QBrush::QBrush(&local_f0,pQVar14);
LAB_004f1c02:
    iVar8 = QFontMetrics::lineSpacing(&local_a0);
    dVar21 = (double)(iVar8 / 6);
    local_118.h = (qreal)-(iVar8 / 6);
    local_e8.xp = local_118.h + local_e8.xp;
    local_e8.yp = local_e8.yp + 0.0;
    local_e8.w = local_e8.w + 0.0;
    local_e8.h = local_e8.h + 0.0;
    local_118.xp = local_e8.xp + local_118.h;
    local_118.yp = local_e8.yp + local_118.h;
    local_118.w = (dVar21 + local_e8.w) - local_118.h;
    local_118.h = (dVar21 + local_e8.h) - local_118.h;
    if (selectionFormat != (QTextCharFormat *)0x0) {
      QTextFormat::brushProperty((QTextFormat *)&local_58,iVar9);
      QPainter::fillRect(painter,&local_118,(QBrush *)&local_58);
      QBrush::~QBrush((QBrush *)&local_58);
    }
    QTextBlock::blockFormat((QTextBlock *)&local_58);
    iVar8 = QTextFormat::intProperty((QTextFormat *)&local_58,0x10a0);
    QTextFormat::~QTextFormat((QTextFormat *)&local_58);
    if (iVar8 == 2) {
      pQVar15 = QPainter::pen(painter);
      QVar27 = QPen::color(pQVar15);
      local_58.xp = QVar27._0_8_;
      local_58.yp._0_6_ = QVar27.ct._4_6_;
      QBrush::QBrush(local_138,(QColor *)&local_58,SolidPattern);
      QPen::QPen(local_168,local_138,2.0,SolidLine,SquareCap,BevelJoin);
      QPainter::setPen(painter,local_168);
      QPen::~QPen(local_168);
      QBrush::~QBrush(local_138);
      local_58.w = local_e8.w + local_e8.xp;
      local_58.h = local_e8.h + local_e8.yp;
      local_58.xp = local_e8.xp;
      local_58.yp = local_e8.yp;
      QPainter::drawLines(painter,(QLineF *)&local_58,1);
      local_58.xp = local_e8.w + local_e8.xp;
      local_58.h = local_e8.h + local_e8.yp;
      local_58.yp = local_e8.yp;
      local_58.w = local_e8.xp;
      QPainter::drawLines(painter,(QLineF *)&local_58,1);
      pQVar15 = QPainter::pen(painter);
      QVar27 = QPen::color(pQVar15);
      local_58.xp = QVar27._0_8_;
      local_58.yp._0_6_ = QVar27.ct._4_6_;
      QBrush::QBrush(local_138,(QColor *)&local_58,SolidPattern);
      QPen::QPen(local_168,local_138,0.0,SolidLine,SquareCap,BevelJoin);
      QPainter::setPen(painter,local_168);
      QPen::~QPen(local_168);
      QBrush::~QBrush(local_138);
    }
    QPainter::drawRects(painter,&local_118,1);
  }
  if (uVar11 < 8) {
    (*(code *)(&DAT_006bc6a0 + *(int *)(&DAT_006bc6a0 + (ulong)uVar11 * 4)))(this_00);
    return;
  }
  QPainter::restore(painter);
  QBrush::~QBrush(&local_f0);
LAB_004f2021:
  if ((QFontPrivate *)local_b8.d.d != (QFontPrivate *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
    }
  }
  QTextFormat::~QTextFormat((QTextFormat *)local_98);
  QFontMetrics::~QFontMetrics(&local_a0);
  QFont::~QFont((QFont *)local_88);
  QTextFormat::~QTextFormat((QTextFormat *)local_78);
  QTextFormat::~QTextFormat((QTextFormat *)local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentLayoutPrivate::drawListItem(const QPointF &offset, QPainter *painter,
                                              const QAbstractTextDocumentLayout::PaintContext &context,
                                              const QTextBlock &bl, const QTextCharFormat *selectionFormat) const
{
    Q_Q(const QTextDocumentLayout);
    const QTextBlockFormat blockFormat = bl.blockFormat();
    const QTextCharFormat charFormat = bl.charFormat();
    QFont font(charFormat.font());
    if (q->paintDevice())
        font = QFont(font, q->paintDevice());

    const QFontMetrics fontMetrics(font);
    QTextObject * const object = document->objectForFormat(blockFormat);
    const QTextListFormat lf = object->format().toListFormat();
    int style = lf.style();
    QString itemText;
    QSizeF size;

    if (blockFormat.hasProperty(QTextFormat::ListStyle))
        style = QTextListFormat::Style(blockFormat.intProperty(QTextFormat::ListStyle));

    QTextLayout *layout = bl.layout();
    if (layout->lineCount() == 0)
        return;
    QTextLine firstLine = layout->lineAt(0);
    Q_ASSERT(firstLine.isValid());
    QPointF pos = (offset + layout->position()).toPoint();
    Qt::LayoutDirection dir = bl.textDirection();
    {
        QRectF textRect = firstLine.naturalTextRect();
        pos += textRect.topLeft().toPoint();
        if (dir == Qt::RightToLeft)
            pos.rx() += textRect.width();
    }

    switch (style) {
    case QTextListFormat::ListDecimal:
    case QTextListFormat::ListLowerAlpha:
    case QTextListFormat::ListUpperAlpha:
    case QTextListFormat::ListLowerRoman:
    case QTextListFormat::ListUpperRoman:
        itemText = static_cast<QTextList *>(object)->itemText(bl);
        size.setWidth(fontMetrics.horizontalAdvance(itemText));
        size.setHeight(fontMetrics.height());
        break;

    case QTextListFormat::ListSquare:
    case QTextListFormat::ListCircle:
    case QTextListFormat::ListDisc:
        size.setWidth(fontMetrics.lineSpacing() / 3);
        size.setHeight(size.width());
        break;

    case QTextListFormat::ListStyleUndefined:
        return;
    default: return;
    }

    QRectF r(pos, size);

    qreal xoff = fontMetrics.horizontalAdvance(u' ');
    if (dir == Qt::LeftToRight)
        xoff = -xoff - size.width();
    r.translate( xoff, (fontMetrics.height() / 2) - (size.height() / 2));

    painter->save();

    painter->setRenderHint(QPainter::Antialiasing);

    const bool marker = bl.blockFormat().marker() != QTextBlockFormat::MarkerType::NoMarker;
    if (selectionFormat) {
        painter->setPen(QPen(selectionFormat->foreground(), 0));
        if (!marker)
            painter->fillRect(r, selectionFormat->background());
    } else {
        QBrush fg = charFormat.foreground();
        if (fg == Qt::NoBrush)
            fg = context.palette.text();
        painter->setPen(QPen(fg, 0));
    }

    QBrush brush = context.palette.brush(QPalette::Text);

    if (marker) {
        int adj = fontMetrics.lineSpacing() / 6;
        r.adjust(-adj, 0, -adj, 0);
        const QRectF outer = r.adjusted(-adj, -adj, adj, adj);
        if (selectionFormat)
            painter->fillRect(outer, selectionFormat->background());
        if (bl.blockFormat().marker() == QTextBlockFormat::MarkerType::Checked) {
            // ### Qt7: render with QStyle / PE_IndicatorCheckBox. We don't currently
            // have access to that here, because it would be a widget dependency.
            painter->setPen(QPen(painter->pen().color(), 2));
            painter->drawLine(r.topLeft(), r.bottomRight());
            painter->drawLine(r.topRight(), r.bottomLeft());
            painter->setPen(QPen(painter->pen().color(), 0));
        }
        painter->drawRect(outer);
    }

    switch (style) {
    case QTextListFormat::ListDecimal:
    case QTextListFormat::ListLowerAlpha:
    case QTextListFormat::ListUpperAlpha:
    case QTextListFormat::ListLowerRoman:
    case QTextListFormat::ListUpperRoman: {
        QTextLayout layout(itemText, font, q->paintDevice());
        layout.setCacheEnabled(true);
        QTextOption option(Qt::AlignLeft | Qt::AlignAbsolute);
        option.setTextDirection(dir);
        layout.setTextOption(option);
        layout.beginLayout();
        QTextLine line = layout.createLine();
        if (line.isValid())
            line.setLeadingIncluded(true);
        layout.endLayout();
        layout.draw(painter, QPointF(r.left(), pos.y()));
        break;
    }
    case QTextListFormat::ListSquare:
        if (!marker)
            painter->fillRect(r, painter->pen().brush());
        break;
    case QTextListFormat::ListCircle:
        if (!marker)
            painter->drawEllipse(r.translated(0.5, 0.5)); // pixel align for sharper rendering
        break;
    case QTextListFormat::ListDisc:
        if (!marker) {
            painter->setBrush(painter->pen().brush());
            painter->setPen(Qt::NoPen);
            painter->drawEllipse(r);
        }
        break;
    case QTextListFormat::ListStyleUndefined:
        break;
    default:
        break;
    }

    painter->restore();
}